

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VectorIO.cpp
# Opt level: O3

void amrex::writeLongData(Long *data,size_t size,ostream *os,IntDescriptor *id)

{
  bool bVar1;
  int iVar2;
  IntDescriptor *id_00;
  
  id_00 = FPC::NativeLongDescriptor();
  bVar1 = IntDescriptor::operator==(id,id_00);
  if (bVar1) {
    std::ostream::write((char *)os,(long)data);
    return;
  }
  iVar2 = IntDescriptor::numBytes(id);
  if (iVar2 == 2) {
    writeIntData<short,long>(data,size,os,id);
    return;
  }
  iVar2 = IntDescriptor::numBytes(id);
  if (iVar2 == 4) {
    writeIntData<int,long>(data,size,os,id);
    return;
  }
  iVar2 = IntDescriptor::numBytes(id);
  if (iVar2 == 8) {
    writeIntData<long,long>(data,size,os,id);
    return;
  }
  Error_host("Don\'t know how to work with this long type.");
  return;
}

Assistant:

void amrex::writeLongData (const Long* data, std::size_t size, std::ostream& os,
                           const IntDescriptor& id)
{
    if (id == FPC::NativeLongDescriptor())
    {
        os.write((char*) data, size*sizeof(Long));
    }
    else if (id.numBytes() == 2)
    {
        writeIntData<std::int16_t, Long>(data, size, os, id);
    }
    else if (id.numBytes() == 4)
    {
        writeIntData<std::int32_t, Long>(data, size, os, id);
    }
    else if (id.numBytes() == 8)
    {
        writeIntData<std::int64_t, Long>(data, size, os, id);
    }
    else {
        amrex::Error("Don't know how to work with this long type.");
    }
}